

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O2

void __thiscall nesvis::PpuWidget::draw_palettes(PpuWidget *this)

{
  undefined1 auVar1 [13];
  undefined1 auVar2 [13];
  bool bVar3;
  uint uVar4;
  Color CVar5;
  IPpu *pIVar6;
  ImGuiStyle *pIVar7;
  uint16_t address;
  uint uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  allocator<char> local_14f;
  allocator<char> local_14e;
  allocator<char> local_14d;
  allocator<char> local_14c;
  allocator<char> local_14b;
  allocator<char> local_14a;
  allocator<char> local_149;
  ImVec4 local_148;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  palette_text;
  
  ImGui::Text("Background palette");
  ImGui::PushID("background palette");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&palette_text,"Background 0",(allocator<char> *)&local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(palette_text._M_elems + 1),"Background 1",&local_149);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(palette_text._M_elems + 2),"Background 2",&local_14a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(palette_text._M_elems + 3),"Background 3",&local_14b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(palette_text._M_elems + 4),"Sprite 0",&local_14c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(palette_text._M_elems + 5),"Sprite 1",&local_14d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(palette_text._M_elems + 6),"Sprite 2",&local_14e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(palette_text._M_elems + 7),"Sprite 3",&local_14f);
  iVar9 = 0;
  for (uVar8 = 0x3f00; uVar8 != 0x3f20; uVar8 = uVar8 + 1) {
    pIVar6 = n_e_s::nes::Nes::ppu(this->nes_);
    uVar4 = (*pIVar6->_vptr_IPpu[2])(pIVar6,(ulong)(uVar8 & 0xffff));
    uVar4 = uVar4 & 0xff;
    ImGui::PushID(uVar4);
    if ((uVar8 & 3) == 0) {
      ImGui::Text("%s",palette_text._M_elems[iVar9]._M_dataplus._M_p);
      ImGui::SameLine(100.0,-1.0);
      iVar9 = iVar9 + 1;
    }
    else {
      pIVar7 = ImGui::GetStyle();
      ImGui::SameLine(0.0,(pIVar7->ItemSpacing).y);
    }
    CVar5 = PpuHelper::get_color_from_index(this->ppu_helper_,(uint16_t)uVar4);
    auVar1[0xc] = CVar5.a;
    auVar1._0_12_ = ZEXT712(0);
    auVar10._0_4_ = (float)((uint)CVar5 & 0xff);
    auVar10._4_4_ = (float)((uint)CVar5 >> 8 & 0xff);
    auVar10._8_4_ = (float)(int)CONCAT32(auVar1._10_3_,(ushort)CVar5.b);
    auVar10._12_4_ = (float)(uint3)(auVar1._10_3_ >> 0x10);
    local_148 = (ImVec4)divps(auVar10,_DAT_001b55b0);
    ImGui::ColorButton("##backgroundpalette",&local_148,0x44,(ImVec2)0x41a0000041a00000);
    bVar3 = ImGui::IsItemHovered(0);
    if (bVar3) {
      ImGui::BeginTooltip();
      ImGui::Text("Address: %04hX",(ulong)uVar8);
      ImGui::Text("index: %02hhX",(ulong)uVar4);
      ImGui::EndTooltip();
    }
    ImGui::PopID();
  }
  ImGui::PopID();
  ImGui::PushID("palette");
  for (uVar8 = 0; uVar8 != 0x40; uVar8 = uVar8 + 1) {
    ImGui::PushID(uVar8);
    if ((uVar8 & 0xf) != 0) {
      pIVar7 = ImGui::GetStyle();
      ImGui::SameLine(0.0,(pIVar7->ItemSpacing).y);
    }
    CVar5 = PpuHelper::get_color_from_index(this->ppu_helper_,(uint16_t)uVar8);
    auVar2[0xc] = CVar5.a;
    auVar2._0_12_ = ZEXT712(0);
    auVar11._0_4_ = (float)((uint)CVar5 & 0xff);
    auVar11._4_4_ = (float)((uint)CVar5 >> 8 & 0xff);
    auVar11._8_4_ = (float)(int)CONCAT32(auVar2._10_3_,(ushort)CVar5.b);
    auVar11._12_4_ = (float)(uint3)(auVar2._10_3_ >> 0x10);
    local_148 = (ImVec4)divps(auVar11,_DAT_001b55b0);
    ImGui::ColorButton("##palette",&local_148,4,(ImVec2)0x41a0000041a00000);
    ImGui::PopID();
  }
  ImGui::PopID();
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>::
  ~array(&palette_text);
  return;
}

Assistant:

void PpuWidget::draw_palettes() {
    ImGui::Text("Background palette");
    ImGui::PushID("background palette");

    const std::array<std::string, 8> palette_text = {"Background 0",
            "Background 1",
            "Background 2",
            "Background 3",
            "Sprite 0",
            "Sprite 1",
            "Sprite 2",
            "Sprite 3"};
    int text_index = 0;

    for (uint16_t address = 0x3F00; address < 0x3F20; ++address) {
        const uint8_t palette_index = nes_->ppu().read_byte(address);
        ImGui::PushID(palette_index);
        if ((address % 4) == 0) {
            ImGui::Text("%s", palette_text[text_index++].c_str());
            ImGui::SameLine(100);
        }
        if ((address % 4) != 0) {
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemSpacing.y);
        }
        const ImVec4 color = ppu_helper_->get_color_from_index(palette_index);
        ImGui::ColorButton("##backgroundpalette",
                color,
                ImGuiColorEditFlags_NoPicker | ImGuiColorEditFlags_NoTooltip,
                ImVec2(20, 20));
        if (ImGui::IsItemHovered()) {
            ImGui::BeginTooltip();
            ImGui::Text("Address: %04hX", address);
            ImGui::Text("index: %02hhX", palette_index);
            ImGui::EndTooltip();
        }

        ImGui::PopID();
    }
    ImGui::PopID(); // background palette

    ImGui::PushID("palette");
    for (int n = 0; n < ppu_helper_->kPaletteSize; n++) {
        ImGui::PushID(n);
        if ((n % 16) != 0) {
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemSpacing.y);
        }
        const ImVec4 color = ppu_helper_->get_color_from_index(n);
        ImGui::ColorButton("##palette",
                color,
                ImGuiColorEditFlags_NoPicker,
                ImVec2(20, 20));

        ImGui::PopID();
    }
    ImGui::PopID(); // palette
}